

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon.cpp
# Opt level: O0

void __thiscall
QSystemTrayIcon::showMessage
          (QSystemTrayIcon *this,QString *title,QString *msg,MessageIcon msgIcon,int msecs)

{
  long lVar1;
  QSystemTrayIconPrivate *pQVar2;
  MessageIcon in_ECX;
  QIcon *in_RDX;
  QString *in_RSI;
  QString *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  QSystemTrayIconPrivate *d;
  QIcon in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QSystemTrayIcon *)0x490068);
  if ((pQVar2->visible & 1U) != 0) {
    messageIcon2qIcon((MessageIcon)((ulong)in_RSI >> 0x20));
    QSystemTrayIconPrivate::showMessage_sys
              ((QSystemTrayIconPrivate *)in_stack_fffffffffffffff0.d,in_RDI,in_RSI,in_RDX,in_ECX,
               in_R8D);
    QIcon::~QIcon((QIcon *)&stack0xfffffffffffffff0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSystemTrayIcon::showMessage(const QString& title, const QString& msg,
                            QSystemTrayIcon::MessageIcon msgIcon, int msecs)
{
    Q_D(QSystemTrayIcon);
    if (d->visible)
        d->showMessage_sys(title, msg, messageIcon2qIcon(msgIcon), msgIcon, msecs);
}